

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tty.c
# Opt level: O0

int run_test_tty_file(void)

{
  int iVar1;
  int iVar2;
  int64_t eval_b_15;
  int64_t eval_a_15;
  int64_t eval_b_14;
  int64_t eval_a_14;
  int64_t eval_b_13;
  int64_t eval_a_13;
  int64_t eval_b_12;
  int64_t eval_a_12;
  int64_t eval_b_11;
  int64_t eval_a_11;
  int64_t eval_b_10;
  int64_t eval_a_10;
  int64_t eval_b_9;
  int64_t eval_a_9;
  int64_t eval_b_8;
  int64_t eval_a_8;
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 local_680 [4];
  int fd;
  uv_tty_t tty_wo;
  uv_tty_t tty_ro;
  uv_tty_t tty;
  uv_loop_t loop;
  
  iVar1 = uv_loop_init((uv_loop_t *)&tty.orig_termios.c_ospeed);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
            ,0x14e,"uv_loop_init(&loop)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = open64("test/fixtures/empty_file",0);
  if (iVar1 != -1) {
    iVar2 = uv_tty_init((uv_loop_t *)&tty.orig_termios.c_ospeed,
                        (uv_tty_t *)&tty_ro.orig_termios.c_ospeed,iVar1,1);
    if ((long)iVar2 != -0x16) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
              ,0x152,"UV_EINVAL","==","uv_tty_init(&loop, &tty, fd, 1)",0xffffffffffffffea,"==",
              (long)iVar2);
      abort();
    }
    iVar2 = close(iVar1);
    if ((long)iVar2 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
              ,0x153,"close(fd)","==","0",(long)iVar2,"==",0);
      abort();
    }
    iVar1 = uv_tty_init((uv_loop_t *)&tty.orig_termios.c_ospeed,
                        (uv_tty_t *)&tty_ro.orig_termios.c_ospeed,iVar1,1);
    if ((long)iVar1 != -0x16) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
              ,0x155,"UV_EINVAL","==","uv_tty_init(&loop, &tty, fd, 1)",0xffffffffffffffea,"==",
              (long)iVar1);
      abort();
    }
  }
  iVar1 = open64("/dev/random",0);
  if (iVar1 != -1) {
    iVar2 = uv_tty_init((uv_loop_t *)&tty.orig_termios.c_ospeed,
                        (uv_tty_t *)&tty_ro.orig_termios.c_ospeed,iVar1,1);
    if ((long)iVar2 != -0x16) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
              ,0x15c,"UV_EINVAL","==","uv_tty_init(&loop, &tty, fd, 1)",0xffffffffffffffea,"==",
              (long)iVar2);
      abort();
    }
    iVar1 = close(iVar1);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
              ,0x15d,"close(fd)","==","0",(long)iVar1,"==",0);
      abort();
    }
  }
  iVar1 = open64("/dev/zero",0);
  if (iVar1 != -1) {
    iVar2 = uv_tty_init((uv_loop_t *)&tty.orig_termios.c_ospeed,
                        (uv_tty_t *)&tty_ro.orig_termios.c_ospeed,iVar1,1);
    if ((long)iVar2 != -0x16) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
              ,0x163,"UV_EINVAL","==","uv_tty_init(&loop, &tty, fd, 1)",0xffffffffffffffea,"==",
              (long)iVar2);
      abort();
    }
    iVar1 = close(iVar1);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
              ,0x164,"close(fd)","==","0",(long)iVar1,"==",0);
      abort();
    }
  }
  iVar1 = open64("/dev/tty",2);
  if (iVar1 != -1) {
    iVar2 = uv_tty_init((uv_loop_t *)&tty.orig_termios.c_ospeed,
                        (uv_tty_t *)&tty_ro.orig_termios.c_ospeed,iVar1,1);
    if ((long)iVar2 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
              ,0x169,"uv_tty_init(&loop, &tty, fd, 1)","==","0",(long)iVar2,"==",0);
      abort();
    }
    iVar1 = close(iVar1);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
              ,0x16a,"close(fd)","==","0",(long)iVar1,"==",0);
      abort();
    }
    iVar1 = uv_is_readable((uv_stream_t *)&tty_ro.orig_termios.c_ospeed);
    if (iVar1 == 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
              ,0x16b,"uv_is_readable((uv_stream_t*) &tty)");
      abort();
    }
    iVar1 = uv_is_writable((uv_stream_t *)&tty_ro.orig_termios.c_ospeed);
    if (iVar1 == 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
              ,0x16c,"uv_is_writable((uv_stream_t*) &tty)");
      abort();
    }
    uv_close((uv_handle_t *)&tty_ro.orig_termios.c_ospeed,(uv_close_cb)0x0);
    iVar1 = uv_is_readable((uv_stream_t *)&tty_ro.orig_termios.c_ospeed);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
              ,0x16e,"!uv_is_readable((uv_stream_t*) &tty)");
      abort();
    }
    iVar1 = uv_is_writable((uv_stream_t *)&tty_ro.orig_termios.c_ospeed);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
              ,0x16f,"!uv_is_writable((uv_stream_t*) &tty)");
      abort();
    }
  }
  iVar1 = open64("/dev/tty",0);
  if (iVar1 != -1) {
    iVar2 = uv_tty_init((uv_loop_t *)&tty.orig_termios.c_ospeed,
                        (uv_tty_t *)&tty_wo.orig_termios.c_ospeed,iVar1,1);
    if ((long)iVar2 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
              ,0x174,"uv_tty_init(&loop, &tty_ro, fd, 1)","==","0",(long)iVar2,"==",0);
      abort();
    }
    iVar1 = close(iVar1);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
              ,0x175,"close(fd)","==","0",(long)iVar1,"==",0);
      abort();
    }
    iVar1 = uv_is_readable((uv_stream_t *)&tty_wo.orig_termios.c_ospeed);
    if (iVar1 == 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
              ,0x176,"uv_is_readable((uv_stream_t*) &tty_ro)");
      abort();
    }
    iVar1 = uv_is_writable((uv_stream_t *)&tty_wo.orig_termios.c_ospeed);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
              ,0x177,"!uv_is_writable((uv_stream_t*) &tty_ro)");
      abort();
    }
    uv_close((uv_handle_t *)&tty_wo.orig_termios.c_ospeed,(uv_close_cb)0x0);
    iVar1 = uv_is_readable((uv_stream_t *)&tty_wo.orig_termios.c_ospeed);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
              ,0x179,"!uv_is_readable((uv_stream_t*) &tty_ro)");
      abort();
    }
    iVar1 = uv_is_writable((uv_stream_t *)&tty_wo.orig_termios.c_ospeed);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
              ,0x17a,"!uv_is_writable((uv_stream_t*) &tty_ro)");
      abort();
    }
  }
  iVar1 = open64("/dev/tty",1);
  if (iVar1 != -1) {
    iVar2 = uv_tty_init((uv_loop_t *)&tty.orig_termios.c_ospeed,(uv_tty_t *)local_680,iVar1,0);
    if ((long)iVar2 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
              ,0x17f,"uv_tty_init(&loop, &tty_wo, fd, 0)","==","0",(long)iVar2,"==",0);
      abort();
    }
    iVar1 = close(iVar1);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
              ,0x180,"close(fd)","==","0",(long)iVar1,"==",0);
      abort();
    }
    iVar1 = uv_is_readable((uv_stream_t *)local_680);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
              ,0x181,"!uv_is_readable((uv_stream_t*) &tty_wo)");
      abort();
    }
    iVar1 = uv_is_writable((uv_stream_t *)local_680);
    if (iVar1 == 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
              ,0x182,"uv_is_writable((uv_stream_t*) &tty_wo)");
      abort();
    }
    uv_close((uv_handle_t *)local_680,(uv_close_cb)0x0);
    iVar1 = uv_is_readable((uv_stream_t *)local_680);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
              ,0x184,"!uv_is_readable((uv_stream_t*) &tty_wo)");
      abort();
    }
    iVar1 = uv_is_writable((uv_stream_t *)local_680);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
              ,0x185,"!uv_is_writable((uv_stream_t*) &tty_wo)");
      abort();
    }
  }
  iVar1 = uv_run((uv_loop_t *)&tty.orig_termios.c_ospeed,UV_RUN_DEFAULT);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
            ,0x189,"uv_run(&loop, UV_RUN_DEFAULT)","==","0",(long)iVar1,"==",0);
    abort();
  }
  close_loop((uv_loop_t *)&tty.orig_termios.c_ospeed);
  iVar1 = uv_loop_close((uv_loop_t *)&tty.orig_termios.c_ospeed);
  if ((long)iVar1 == 0) {
    uv_library_shutdown();
    return 0;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
          ,0x18b,"0","==","uv_loop_close(&loop)",0,"==",(long)iVar1);
  abort();
}

Assistant:

TEST_IMPL(tty_file) {
#ifndef _WIN32
  uv_loop_t loop;
  uv_tty_t tty;
  uv_tty_t tty_ro;
  uv_tty_t tty_wo;
  int fd;

  ASSERT_OK(uv_loop_init(&loop));

  fd = open("test/fixtures/empty_file", O_RDONLY);
  if (fd != -1) {
    ASSERT_EQ(UV_EINVAL, uv_tty_init(&loop, &tty, fd, 1));
    ASSERT_OK(close(fd));
    /* test EBADF handling */
    ASSERT_EQ(UV_EINVAL, uv_tty_init(&loop, &tty, fd, 1));
  }

/* Bug on AIX where '/dev/random' returns 1 from isatty() */
#ifndef _AIX
  fd = open("/dev/random", O_RDONLY);
  if (fd != -1) {
    ASSERT_EQ(UV_EINVAL, uv_tty_init(&loop, &tty, fd, 1));
    ASSERT_OK(close(fd));
  }
#endif /* _AIX */

  fd = open("/dev/zero", O_RDONLY);
  if (fd != -1) {
    ASSERT_EQ(UV_EINVAL, uv_tty_init(&loop, &tty, fd, 1));
    ASSERT_OK(close(fd));
  }

  fd = open("/dev/tty", O_RDWR);
  if (fd != -1) {
    ASSERT_OK(uv_tty_init(&loop, &tty, fd, 1));
    ASSERT_OK(close(fd)); /* TODO: it's indeterminate who owns fd now */
    ASSERT(uv_is_readable((uv_stream_t*) &tty));
    ASSERT(uv_is_writable((uv_stream_t*) &tty));
    uv_close((uv_handle_t*) &tty, NULL);
    ASSERT(!uv_is_readable((uv_stream_t*) &tty));
    ASSERT(!uv_is_writable((uv_stream_t*) &tty));
  }

  fd = open("/dev/tty", O_RDONLY);
  if (fd != -1) {
    ASSERT_OK(uv_tty_init(&loop, &tty_ro, fd, 1));
    ASSERT_OK(close(fd)); /* TODO: it's indeterminate who owns fd now */
    ASSERT(uv_is_readable((uv_stream_t*) &tty_ro));
    ASSERT(!uv_is_writable((uv_stream_t*) &tty_ro));
    uv_close((uv_handle_t*) &tty_ro, NULL);
    ASSERT(!uv_is_readable((uv_stream_t*) &tty_ro));
    ASSERT(!uv_is_writable((uv_stream_t*) &tty_ro));
  }

  fd = open("/dev/tty", O_WRONLY);
  if (fd != -1) {
    ASSERT_OK(uv_tty_init(&loop, &tty_wo, fd, 0));
    ASSERT_OK(close(fd)); /* TODO: it's indeterminate who owns fd now */
    ASSERT(!uv_is_readable((uv_stream_t*) &tty_wo));
    ASSERT(uv_is_writable((uv_stream_t*) &tty_wo));
    uv_close((uv_handle_t*) &tty_wo, NULL);
    ASSERT(!uv_is_readable((uv_stream_t*) &tty_wo));
    ASSERT(!uv_is_writable((uv_stream_t*) &tty_wo));
  }


  ASSERT_OK(uv_run(&loop, UV_RUN_DEFAULT));

  MAKE_VALGRIND_HAPPY(&loop);
#endif
  return 0;
}